

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

const_iterator * __thiscall llvm::sys::path::const_iterator::operator++(const_iterator *this)

{
  StringRef *pSVar1;
  char cVar2;
  Style SVar3;
  ulong uVar4;
  size_type sVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  bool bVar9;
  StringRef Chars;
  
  uVar4 = (this->Path).Length;
  if (uVar4 <= this->Position) {
    __assert_fail("Position < Path.size() && \"Tried to increment past end!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/Path.cpp"
                  ,0xc4,"const_iterator &llvm::sys::path::const_iterator::operator++()");
  }
  pSVar1 = &this->Component;
  uVar7 = (this->Component).Length;
  uVar6 = this->Position + uVar7;
  this->Position = uVar6;
  if (uVar6 == uVar4) {
    pSVar1->Data = (char *)0x0;
    (this->Component).Length = 0;
    return this;
  }
  if (uVar7 < 3) {
LAB_00d9999a:
    bVar9 = false;
  }
  else {
    pcVar8 = (this->Component).Data;
    cVar2 = *pcVar8;
    if ((((cVar2 != '/') && (cVar2 != '\\' || this->S != windows)) || (pcVar8[1] != cVar2)) ||
       (pcVar8[2] == '/')) goto LAB_00d9999a;
    bVar9 = pcVar8[2] != '\\' || this->S != windows;
  }
  if (uVar4 <= uVar6) {
LAB_00d99acb:
    __assert_fail("Index < Length && \"Invalid index!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                  ,0xf9,"char llvm::StringRef::operator[](size_t) const");
  }
  pcVar8 = (this->Path).Data;
  SVar3 = this->S;
  if ((pcVar8[uVar6] == '/') || (pcVar8[uVar6] == '\\' && SVar3 == windows)) {
    if ((bVar9) || ((uVar7 != 0 && SVar3 == windows && (pSVar1->Data[uVar7 - 1] == ':')))) {
      (this->Component).Data = pcVar8 + uVar6;
    }
    else {
      do {
        if (uVar4 <= uVar6) goto LAB_00d99acb;
        if ((pcVar8[uVar6] != '/') && (SVar3 != windows || pcVar8[uVar6] != '\\'))
        goto LAB_00d99a42;
        uVar6 = uVar6 + 1;
        this->Position = uVar6;
      } while (uVar4 != uVar6);
      if ((uVar7 == 1) && (uVar6 = uVar4, *pSVar1->Data == '/')) goto LAB_00d99a42;
      this->Position = uVar4 - 1;
      (this->Component).Data = ".";
    }
    (this->Component).Length = 1;
  }
  else {
LAB_00d99a42:
    pcVar8 = "/";
    if (SVar3 == windows) {
      pcVar8 = "\\/";
    }
    Chars.Length = (ulong)(SVar3 == windows) + 1;
    Chars.Data = pcVar8;
    sVar5 = StringRef::find_first_of(&this->Path,Chars,uVar6);
    uVar4 = (this->Path).Length;
    uVar7 = this->Position;
    if (uVar4 < this->Position) {
      uVar7 = uVar4;
    }
    uVar6 = sVar5;
    if (sVar5 < uVar7) {
      uVar6 = uVar7;
    }
    if (uVar4 < sVar5) {
      uVar6 = uVar4;
    }
    (this->Component).Data = (this->Path).Data + uVar7;
    (this->Component).Length = uVar6 - uVar7;
  }
  return this;
}

Assistant:

const_iterator &const_iterator::operator++() {
  assert(Position < Path.size() && "Tried to increment past end!");

  // Increment Position to past the current component
  Position += Component.size();

  // Check for end.
  if (Position == Path.size()) {
    Component = StringRef();
    return *this;
  }

  // Both POSIX and Windows treat paths that begin with exactly two separators
  // specially.
  bool was_net = Component.size() > 2 && is_separator(Component[0], S) &&
                 Component[1] == Component[0] && !is_separator(Component[2], S);

  // Handle separators.
  if (is_separator(Path[Position], S)) {
    // Root dir.
    if (was_net ||
        // c:/
        (real_style(S) == Style::windows && Component.endswith(":"))) {
      Component = Path.substr(Position, 1);
      return *this;
    }

    // Skip extra separators.
    while (Position != Path.size() && is_separator(Path[Position], S)) {
      ++Position;
    }

    // Treat trailing '/' as a '.', unless it is the root dir.
    if (Position == Path.size() && Component != "/") {
      --Position;
      Component = ".";
      return *this;
    }
  }

  // Find next component.
  size_t end_pos = Path.find_first_of(separators(S), Position);
  Component = Path.slice(Position, end_pos);

  return *this;
}